

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInCount(void *handle,int net_type,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  bool is_bitcoin;
  TransactionContext tx;
  allocator local_12a;
  bool local_129;
  string local_128;
  ConfidentialTransactionContext local_108;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    local_129 = false;
    cfd::capi::ConvertNetType(net_type,&local_129);
    if (local_129 == true) {
      std::__cxx11::string::string((string *)&local_128,tx_hex_string,&local_12a);
      cfd::TransactionContext::TransactionContext((TransactionContext *)&local_108,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (count != (uint32_t *)0x0) {
        uVar2 = cfd::core::Transaction::GetTxInCount((Transaction *)&local_108);
        *count = uVar2;
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_108);
    }
    else {
      std::__cxx11::string::string((string *)&local_128,tx_hex_string,&local_12a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_108,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (count != (uint32_t *)0x0) {
        uVar2 = cfd::core::ConfidentialTransaction::GetTxInCount
                          (&local_108.super_ConfidentialTransaction);
        *count = uVar2;
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_108);
    }
    return 0;
  }
  local_108.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x63077b;
  local_108.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xa73;
  local_108.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x630b6b;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_108,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_108.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_108.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_108);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInCount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxInCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxInCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}